

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::eq_bool(Parser *this)

{
  lex_t lVar1;
  reference this_00;
  undefined8 *puVar2;
  Parser *this_local;
  
  this_00 = std::stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_>::top(&this->lex_stack);
  lVar1 = Lex::get_type(this_00);
  if (lVar1 != LEX_BOOL) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "expression is not boolean";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  std::stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_>::pop(&this->lex_stack);
  return;
}

Assistant:

void Parser::eq_bool() {
    if ( lex_stack.top().get_type() != LEX_BOOL )
        throw "expression is not boolean";
    lex_stack.pop();
}